

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  ImGuiContext *pIVar1;
  uint in_EDX;
  float thickness;
  ImVec2 *in_RSI;
  ImGuiTabBar *in_RDI;
  ImGuiPtrOrIndex IVar2;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPtrOrIndex *in_stack_ffffffffffffff68;
  ImGuiTabBar *in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImVec2 local_78;
  float local_70;
  float local_6c;
  float local_68;
  ImU32 local_64;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 *local_50;
  ImU32 in_stack_ffffffffffffffbc;
  ImVec2 *p2;
  float fVar3;
  undefined4 in_stack_ffffffffffffffcc;
  ImGuiWindow *this;
  uint local_1c;
  bool local_1;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    if ((in_EDX & 0x100000) == 0) {
      PushOverrideID((ImGuiID)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    }
    IVar2 = GetTabBarRefFromTabBar(in_stack_ffffffffffffff70);
    local_50 = (ImVec2 *)IVar2.Ptr;
    thickness = (float)IVar2.Index;
    p2 = local_50;
    fVar3 = thickness;
    ImVector<ImGuiPtrOrIndex>::push_back
              ((ImVector<ImGuiPtrOrIndex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pIVar1->CurrentTabBar = in_RDI;
    in_RDI->BackupCursorPos = (this->DC).CursorPos;
    if (in_RDI->CurrFrameVisible == pIVar1->FrameCount) {
      ImVec2::ImVec2(&local_58,(in_RDI->BarRect).Min.x,
                     (in_RDI->BarRect).Max.y + in_RDI->ItemSpacingY);
      (this->DC).CursorPos = local_58;
      in_RDI->BeginCount = in_RDI->BeginCount + '\x01';
      local_1 = true;
    }
    else {
      if ((((in_EDX & 1) != (in_RDI->Flags & 1U)) ||
          (((in_RDI->TabsAddedNew & 1U) != 0 && ((in_EDX & 1) == 0)))) && (1 < (in_RDI->Tabs).Size))
      {
        qsort((in_RDI->Tabs).Data,(long)(in_RDI->Tabs).Size,0x24,TabItemComparerByBeginOrder);
      }
      in_RDI->TabsAddedNew = false;
      local_1c = in_EDX;
      if ((in_EDX & 0xc0) == 0) {
        local_1c = in_EDX | 0x40;
      }
      in_RDI->Flags = local_1c;
      (in_RDI->BarRect).Min = *in_RSI;
      (in_RDI->BarRect).Max = in_RSI[1];
      in_RDI->WantLayout = true;
      in_RDI->PrevFrameVisible = in_RDI->CurrFrameVisible;
      in_RDI->CurrFrameVisible = pIVar1->FrameCount;
      in_RDI->PrevTabsContentsHeight = in_RDI->CurrTabsContentsHeight;
      in_RDI->CurrTabsContentsHeight = 0.0;
      in_RDI->ItemSpacingY = (pIVar1->Style).ItemSpacing.y;
      in_RDI->FramePadding = (pIVar1->Style).FramePadding;
      in_RDI->TabsActiveCount = 0;
      in_RDI->BeginCount = '\x01';
      ImVec2::ImVec2(&local_60,(in_RDI->BarRect).Min.x,
                     (in_RDI->BarRect).Max.y + in_RDI->ItemSpacingY);
      (this->DC).CursorPos = local_60;
      local_64 = GetColorU32((ImGuiCol)in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      local_68 = (in_RDI->BarRect).Max.y - 1.0;
      local_6c = (in_RDI->BarRect).Min.x - (float)(int)((this->WindowPadding).x * 0.5);
      local_70 = (in_RDI->BarRect).Max.x + (float)(int)((this->WindowPadding).x * 0.5);
      ImVec2::ImVec2(&local_78,local_6c,local_68);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,local_70,local_68);
      ImDrawList::AddLine((ImDrawList *)this,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,fVar3),p2,
                          in_stack_ffffffffffffffbc,thickness);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        if (tab_bar->Tabs.Size > 1)
            ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}